

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.cpp
# Opt level: O3

void fe::operations::blitColored(ImageData *src,ImageData *dest,Color *c)

{
  op_blit_colored op;
  op_blit_colored local_4;
  
  applyOperation<fe::operations::op_blit_colored>(&local_4,src,dest);
  return;
}

Assistant:

void blitColored(const ImageData& src, const ImageData& dest, const Color& c)
        {
            Pixel p;
            p.r = c.rgba.r;
            p.g = c.rgba.g;
            p.b = c.rgba.b;
            p.a = c.rgba.a;

            op_blit_colored op(p);
            applyOperation(op, src, dest);
        }